

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlNodeSetPtr xmlXPathNodeSetCreate(xmlNodePtr val)

{
  int iVar1;
  xmlNodeSetPtr obj;
  xmlNodePtr *ppxVar2;
  xmlNodePtr pxVar3;
  
  obj = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
  if (obj != (xmlNodeSetPtr)0x0) {
    obj->nodeNr = 0;
    obj->nodeMax = 0;
    obj->nodeTab = (xmlNodePtr *)0x0;
    if (val == (xmlNodePtr)0x0) {
      return obj;
    }
    ppxVar2 = (xmlNodePtr *)(*xmlMalloc)(0x50);
    obj->nodeTab = ppxVar2;
    if (ppxVar2 == (xmlNodePtr *)0x0) {
      (*xmlFree)(obj);
    }
    else {
      ppxVar2[8] = (xmlNodePtr)0x0;
      ppxVar2[9] = (xmlNodePtr)0x0;
      ppxVar2[6] = (xmlNodePtr)0x0;
      ppxVar2[7] = (xmlNodePtr)0x0;
      ppxVar2[4] = (xmlNodePtr)0x0;
      ppxVar2[5] = (xmlNodePtr)0x0;
      ppxVar2[2] = (xmlNodePtr)0x0;
      ppxVar2[3] = (xmlNodePtr)0x0;
      *ppxVar2 = (xmlNodePtr)0x0;
      ppxVar2[1] = (xmlNodePtr)0x0;
      obj->nodeMax = 10;
      if (val->type != XML_NAMESPACE_DECL) {
        iVar1 = obj->nodeNr;
        obj->nodeNr = iVar1 + 1;
        obj->nodeTab[iVar1] = val;
        return obj;
      }
      pxVar3 = xmlXPathNodeSetDupNs((xmlNodePtr)val->_private,(xmlNsPtr)val);
      if (pxVar3 != (xmlNodePtr)0x0) {
        iVar1 = obj->nodeNr;
        obj->nodeNr = iVar1 + 1;
        obj->nodeTab[iVar1] = pxVar3;
        return obj;
      }
      xmlXPathFreeNodeSet(obj);
    }
  }
  return (xmlNodeSetPtr)0x0;
}

Assistant:

xmlNodeSetPtr
xmlXPathNodeSetCreate(xmlNodePtr val) {
    xmlNodeSetPtr ret;

    ret = (xmlNodeSetPtr) xmlMalloc(sizeof(xmlNodeSet));
    if (ret == NULL)
	return(NULL);
    memset(ret, 0 , sizeof(xmlNodeSet));
    if (val != NULL) {
        ret->nodeTab = (xmlNodePtr *) xmlMalloc(XML_NODESET_DEFAULT *
					     sizeof(xmlNodePtr));
	if (ret->nodeTab == NULL) {
	    xmlFree(ret);
	    return(NULL);
	}
	memset(ret->nodeTab, 0 ,
	       XML_NODESET_DEFAULT * sizeof(xmlNodePtr));
        ret->nodeMax = XML_NODESET_DEFAULT;
	if (val->type == XML_NAMESPACE_DECL) {
	    xmlNsPtr ns = (xmlNsPtr) val;
            xmlNodePtr nsNode = xmlXPathNodeSetDupNs((xmlNodePtr) ns->next, ns);

            if (nsNode == NULL) {
                xmlXPathFreeNodeSet(ret);
                return(NULL);
            }
	    ret->nodeTab[ret->nodeNr++] = nsNode;
	} else
	    ret->nodeTab[ret->nodeNr++] = val;
    }
    return(ret);
}